

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

void __thiscall kj::BufferedInputStreamWrapper::skip(BufferedInputStreamWrapper *this,size_t bytes)

{
  ssize_t sVar1;
  ulong uVar2;
  
  uVar2 = (this->bufferAvailable).size_;
  if (uVar2 < bytes) {
    uVar2 = bytes - uVar2;
    if ((this->buffer).size_ < uVar2) {
      (this->bufferAvailable).ptr = (uchar *)0x0;
      (this->bufferAvailable).size_ = 0;
      (*this->inner->_vptr_InputStream[3])(this->inner,uVar2);
      return;
    }
    sVar1 = InputStream::read(this->inner,(int)(this->buffer).ptr,(void *)(this->buffer).size_,uVar2
                             );
    (this->bufferAvailable).ptr = (this->buffer).ptr + uVar2;
    (this->bufferAvailable).size_ = sVar1 - uVar2;
  }
  else {
    (this->bufferAvailable).ptr = (this->bufferAvailable).ptr + bytes;
    (this->bufferAvailable).size_ = uVar2 - bytes;
  }
  return;
}

Assistant:

void BufferedInputStreamWrapper::skip(size_t bytes) {
  if (bytes <= bufferAvailable.size()) {
    bufferAvailable = bufferAvailable.slice(bytes, bufferAvailable.size());
  } else {
    bytes -= bufferAvailable.size();
    if (bytes <= buffer.size()) {
      // Read the next buffer-full.
      size_t n = inner.read(buffer, bytes);
      bufferAvailable = buffer.slice(bytes, n);
    } else {
      // Forward large skip to the underlying stream.
      bufferAvailable = nullptr;
      inner.skip(bytes);
    }
  }
}